

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledOutputFile::Data::~Data(Data *this)

{
  BufferedTile *pBVar1;
  value_type pTVar2;
  bool bVar3;
  pointer_conflict ppVar4;
  TileBuffer *pTVar5;
  reference ppTVar6;
  size_type sVar7;
  reference ppTVar8;
  long in_RDI;
  size_t i_2;
  size_t i_1;
  iterator i;
  map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
  *in_stack_ffffffffffffff98;
  _Rb_tree_iterator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>
  *in_stack_ffffffffffffffa0;
  size_type sVar9;
  BufferedTile *in_stack_ffffffffffffffb0;
  TileBuffer *this_00;
  size_type local_28;
  TileBuffer *local_20;
  _Self local_18;
  _Self local_10 [2];
  
  if (*(void **)(in_RDI + 0xe0) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xe0));
  }
  if (*(void **)(in_RDI + 0xe8) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0xe8));
  }
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
       ::begin(in_stack_ffffffffffffff98);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar3 = std::operator!=(local_10,&local_18);
    if (!bVar3) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>
                           *)0x1f37cb);
    pBVar1 = ppVar4->second;
    if (pBVar1 != (BufferedTile *)0x0) {
      anon_unknown_7::BufferedTile::~BufferedTile(in_stack_ffffffffffffffb0);
      operator_delete(pBVar1,0x28);
    }
    std::
    _Rb_tree_iterator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>
    ::operator++(in_stack_ffffffffffffffa0);
  }
  local_20 = (TileBuffer *)0x0;
  while (this_00 = local_20,
        pTVar5 = (TileBuffer *)
                 std::
                 vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         *)(in_RDI + 0x138)), this_00 < pTVar5) {
    ppTVar6 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(in_RDI + 0x138),(size_type)local_20);
    if (*ppTVar6 != (value_type)0x0) {
      ppTVar6 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              *)(in_RDI + 0x138),(size_type)local_20);
      pTVar2 = *ppTVar6;
      if (pTVar2 != (value_type)0x0) {
        anon_unknown_7::TileBuffer::~TileBuffer(this_00);
        operator_delete(pTVar2,0xb8);
      }
    }
    local_20 = (TileBuffer *)((long)&local_20->uncompressedData + 1);
  }
  local_28 = 0;
  while (sVar9 = local_28,
        sVar7 = std::
                vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                        *)(in_RDI + 0x120)), sVar9 < sVar7) {
    ppTVar8 = std::
              vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                            *)(in_RDI + 0x120),local_28);
    if (*ppTVar8 != (value_type)0x0) {
      operator_delete(*ppTVar8,0x38);
    }
    local_28 = local_28 + 1;
  }
  std::
  map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
  ::~map((map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
          *)0x1f3927);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::~vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
             *)this_00);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ::~vector((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
             *)this_00);
  TileOffsets::~TileOffsets((TileOffsets *)0x1f395a);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x1f3968);
  Header::~Header((Header *)this_00);
  return;
}

Assistant:

DeepTiledOutputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    //
    // Delete all the tile buffers, if any still happen to exist
    //

    for (TileMap::iterator i = tileMap.begin(); i != tileMap.end(); ++i)
        delete i->second;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        if (tileBuffers[i] != 0)
            delete tileBuffers[i];

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];
}